

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRMeshLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::IRRMeshImporter::CanRead
          (IRRMeshImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  char *tokens [1];
  string extension;
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"irrmesh");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&extension,"xml");
    if (bVar1 || checkSig) {
      if (pIOHandler != (IOSystem *)0x0) {
        tokens[0] = "irrmesh";
        bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,1,200,false,false);
      }
    }
    else {
      bVar2 = false;
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool IRRMeshImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    /* NOTE: A simple check for the file extension is not enough
     * here. Irrmesh and irr are easy, but xml is too generic
     * and could be collada, too. So we need to open the file and
     * search for typical tokens.
     */
    const std::string extension = GetExtension(pFile);

    if (extension == "irrmesh")return true;
    else if (extension == "xml" || checkSig)
    {
        /*  If CanRead() is called to check whether the loader
         *  supports a specific file extension in general we
         *  must return true here.
         */
        if (!pIOHandler)return true;
        const char* tokens[] = {"irrmesh"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,1);
    }
    return false;
}